

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

void print<char[19],std::__cxx11::string,char[15],int,char[2],vm::Instruction>
               (ostream *out,char (*t) [19],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               char (*args_1) [15],int *args_2,char (*args_3) [2],Instruction *args_4)

{
  size_t sVar1;
  
  sVar1 = strlen(*t);
  std::__ostream_insert<char,std::char_traits<char>>(out,*t,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,(args->_M_dataplus)._M_p,args->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  sVar1 = strlen(*args_1);
  std::__ostream_insert<char,std::char_traits<char>>(out,*args_1,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  std::ostream::operator<<((ostream *)out,*args_2);
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  sVar1 = strlen(*args_3);
  std::__ostream_insert<char,std::char_traits<char>>(out,*args_3,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  print<vm::Instruction>(out,args_4);
  return;
}

Assistant:

inline void print(std::ostream& out, const T& t, const Args&... args) {
    print(out, t);
	print(out, " ");
    print(out, args...);
}